

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_FabArray.H
# Opt level: O2

void __thiscall amrex::FabArray<amrex::BaseFab<int>_>::clear(FabArray<amrex::BaseFab<int>_> *this)

{
  pointer ppBVar1;
  BaseFab<int> *pBVar2;
  FabFactory<amrex::BaseFab<int>_> *pFVar3;
  pointer pbVar4;
  long lVar5;
  long lVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *t;
  pointer ppBVar7;
  pointer tag;
  
  if (this->define_function_called == true) {
    this->define_function_called = false;
    FabArrayBase::clearThisBD(&this->super_FabArrayBase,false);
  }
  ppBVar1 = (this->m_fabs_v).
            super__Vector_base<amrex::BaseFab<int>_*,_std::allocator<amrex::BaseFab<int>_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  lVar6 = 0;
  for (ppBVar7 = (this->m_fabs_v).
                 super__Vector_base<amrex::BaseFab<int>_*,_std::allocator<amrex::BaseFab<int>_*>_>.
                 _M_impl.super__Vector_impl_data._M_start; ppBVar7 != ppBVar1; ppBVar7 = ppBVar7 + 1
      ) {
    pBVar2 = *ppBVar7;
    if (pBVar2 != (BaseFab<int> *)0x0) {
      lVar5 = pBVar2->truesize << 2;
      if (pBVar2->ptr_owner == false) {
        lVar5 = 0;
      }
      lVar6 = lVar6 + lVar5;
      (*((this->m_factory)._M_t.
         super___uniq_ptr_impl<amrex::FabFactory<amrex::BaseFab<int>_>,_std::default_delete<amrex::FabFactory<amrex::BaseFab<int>_>_>_>
         ._M_t.
         super__Tuple_impl<0UL,_amrex::FabFactory<amrex::BaseFab<int>_>_*,_std::default_delete<amrex::FabFactory<amrex::BaseFab<int>_>_>_>
         .super__Head_base<0UL,_amrex::FabFactory<amrex::BaseFab<int>_>_*,_false>._M_head_impl)->
        _vptr_FabFactory[4])();
    }
  }
  ppBVar7 = (this->m_fabs_v).
            super__Vector_base<amrex::BaseFab<int>_*,_std::allocator<amrex::BaseFab<int>_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if ((this->m_fabs_v).
      super__Vector_base<amrex::BaseFab<int>_*,_std::allocator<amrex::BaseFab<int>_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppBVar7) {
    (this->m_fabs_v).
    super__Vector_base<amrex::BaseFab<int>_*,_std::allocator<amrex::BaseFab<int>_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppBVar7;
  }
  free(this->m_hp_arrays);
  this->m_hp_arrays = (void *)0x0;
  pFVar3 = (this->m_factory)._M_t.
           super___uniq_ptr_impl<amrex::FabFactory<amrex::BaseFab<int>_>,_std::default_delete<amrex::FabFactory<amrex::BaseFab<int>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_amrex::FabFactory<amrex::BaseFab<int>_>_*,_std::default_delete<amrex::FabFactory<amrex::BaseFab<int>_>_>_>
           .super__Head_base<0UL,_amrex::FabFactory<amrex::BaseFab<int>_>_*,_false>._M_head_impl;
  (this->m_factory)._M_t.
  super___uniq_ptr_impl<amrex::FabFactory<amrex::BaseFab<int>_>,_std::default_delete<amrex::FabFactory<amrex::BaseFab<int>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_amrex::FabFactory<amrex::BaseFab<int>_>_*,_std::default_delete<amrex::FabFactory<amrex::BaseFab<int>_>_>_>
  .super__Head_base<0UL,_amrex::FabFactory<amrex::BaseFab<int>_>_*,_false>._M_head_impl =
       (FabFactory<amrex::BaseFab<int>_> *)0x0;
  if (pFVar3 != (FabFactory<amrex::BaseFab<int>_> *)0x0) {
    (*pFVar3->_vptr_FabFactory[1])();
  }
  (this->m_dallocator).m_arena = (Arena *)0x0;
  if (0 < lVar6) {
    pbVar4 = (this->m_tags).
             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (tag = (this->m_tags).
               super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start; tag != pbVar4; tag = tag + 1) {
      FabArrayBase::updateMemUsage(tag,-lVar6,(Arena *)0x0);
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&(this->m_tags).
           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         );
  FabArrayBase::clear(&this->super_FabArrayBase);
  return;
}

Assistant:

void
FabArray<FAB>::clear ()
{
    if (define_function_called)
    {
        define_function_called = false;
        clearThisBD();  //!< addThisBD is called in define
    }

    Long nbytes = 0L;
    for (auto x : m_fabs_v) {
        if (x) {
            nbytes += amrex::nBytesOwned(*x);
            m_factory->destroy(x);
        }
    }
    m_fabs_v.clear();
#ifdef AMREX_USE_GPU
    The_Pinned_Arena()->free(m_hp_arrays);
    The_Arena()->free(m_dp_arrays);
    m_dp_arrays = nullptr;
#else
    std::free(m_hp_arrays);
#endif
    m_hp_arrays = nullptr;
    m_factory.reset();
    m_dallocator.m_arena = nullptr;
    // no need to clear the non-blocking fillboundary stuff

    if (nbytes > 0) {
        for (auto const& t : m_tags) {
            updateMemUsage(t, -nbytes, nullptr);
        }
    }
    m_tags.clear();

    FabArrayBase::clear();
}